

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O1

int32 vector_cmp(float32 *v1,float32 *v2,int32 len)

{
  ulong uVar1;
  
  if (0 < len) {
    uVar1 = 0;
    do {
      if ((float)v1[uVar1] < (float)v2[uVar1]) {
        return -1;
      }
      if ((float)v2[uVar1] < (float)v1[uVar1]) {
        return 1;
      }
      uVar1 = uVar1 + 1;
    } while ((uint)len != uVar1);
  }
  return 0;
}

Assistant:

int32
vector_cmp(float32 * v1, float32 * v2, int32 len)
{
    int32 i;

    for (i = 0; i < len; i++) {
        if (v1[i] < v2[i])
            return -1;
        if (v1[i] > v2[i])
            return 1;
    }

    return 0;
}